

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

fdb_status fdb_kvs_close_all(fdb_kvs_handle *root_handle)

{
  list_elem *plVar1;
  long in_RDI;
  kvs_opened_node *node;
  list_elem *e;
  fdb_status fs;
  list_elem *local_20;
  undefined4 in_stack_ffffffffffffffe8;
  fdb_status in_stack_ffffffffffffffec;
  
  pthread_spin_lock((pthread_spinlock_t *)(*(long *)(in_RDI + 0x28) + 0x20));
  local_20 = list_begin(*(list **)(*(long *)(in_RDI + 0x28) + 8));
  while( true ) {
    if (local_20 == (list_elem *)0x0) {
      pthread_spin_unlock((pthread_spinlock_t *)(*(long *)(in_RDI + 0x28) + 0x20));
      return FDB_RESULT_SUCCESS;
    }
    plVar1 = local_20 + -1;
    local_20 = list_remove(*(list **)(*(long *)(in_RDI + 0x28) + 8),local_20);
    in_stack_ffffffffffffffec =
         _fdb_close((fdb_kvs_handle *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8))
    ;
    if (in_stack_ffffffffffffffec != FDB_RESULT_SUCCESS) break;
    fdb_kvs_info_free((fdb_kvs_handle *)0x1717c9);
    free(plVar1->next);
    free(&plVar1->next);
  }
  pthread_spin_unlock((pthread_spinlock_t *)(*(long *)(in_RDI + 0x28) + 0x20));
  return in_stack_ffffffffffffffec;
}

Assistant:

fdb_status fdb_kvs_close_all(fdb_kvs_handle *root_handle)
{
    fdb_status fs;
    struct list_elem *e;
    struct kvs_opened_node *node;

    spin_lock(&root_handle->fhandle->lock);
    e = list_begin(root_handle->fhandle->handles);
    while (e) {
        node = _get_entry(e, struct kvs_opened_node, le);
        e = list_remove(root_handle->fhandle->handles, &node->le);
        fs = _fdb_close(node->handle);
        if (fs != FDB_RESULT_SUCCESS) {
            spin_unlock(&root_handle->fhandle->lock);
            return fs;
        }
        fdb_kvs_info_free(node->handle);
        free(node->handle);
        free(node);
    }
    spin_unlock(&root_handle->fhandle->lock);

    return FDB_RESULT_SUCCESS;
}